

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_lookup_certificate_add_identity
              (ptls_openssl_lookup_certificate_t *self,char *server_name,EVP_PKEY *key,
              stack_st_X509 *certs)

{
  long lVar1;
  int iVar2;
  OPENSSL_STACK *pOVar3;
  st_ptls_openssl_identity_t **__dest;
  st_ptls_openssl_identity_t *psVar4;
  void *pvVar5;
  st_ptls_openssl_identity_t *local_98;
  uchar *p;
  X509 *pXStack_88;
  int len;
  X509 *cert;
  int local_4c;
  st_ptls_openssl_identity_t *psStack_48;
  int ret;
  size_t i;
  st_ptls_openssl_identity_t **new_identities;
  st_ptls_openssl_identity_t *slot;
  stack_st_X509 *certs_local;
  EVP_PKEY *key_local;
  char *server_name_local;
  ptls_openssl_lookup_certificate_t *self_local;
  
  slot = (st_ptls_openssl_identity_t *)certs;
  certs_local = (stack_st_X509 *)key;
  key_local = (EVP_PKEY *)server_name;
  server_name_local = (char *)self;
  pOVar3 = ossl_check_const_X509_sk_type(certs);
  iVar2 = OPENSSL_sk_num(pOVar3);
  __dest = (st_ptls_openssl_identity_t **)malloc((long)iVar2 * 0x10 + 0x20);
  new_identities = __dest;
  if (__dest == (st_ptls_openssl_identity_t **)0x0) {
    local_4c = 0x201;
  }
  else {
    memset(&cert,0,0x30);
    memcpy(__dest,&cert,0x30);
    psVar4 = (st_ptls_openssl_identity_t *)strdup((char *)key_local);
    *new_identities = psVar4;
    if (psVar4 == (st_ptls_openssl_identity_t *)0x0) {
      local_4c = 0x201;
    }
    else {
      psVar4 = (st_ptls_openssl_identity_t *)strlen((char *)key_local);
      new_identities[1] = psVar4;
      EVP_PKEY_up_ref(certs_local);
      new_identities[2] = (st_ptls_openssl_identity_t *)certs_local;
      iVar2 = EVP_PKEY_get_id(certs_local);
      if (iVar2 != 6) {
        if (iVar2 != 0x198) {
          local_4c = 0x204;
          goto LAB_0011f1a8;
        }
        iVar2 = eckey_is_on_group((EVP_PKEY *)certs_local,0x19f);
        if (iVar2 == 0) {
          local_4c = 0x204;
          goto LAB_0011f1a8;
        }
      }
      pOVar3 = ossl_check_const_X509_sk_type((stack_st_X509 *)slot);
      iVar2 = OPENSSL_sk_num(pOVar3);
      new_identities[3] = (st_ptls_openssl_identity_t *)(long)iVar2;
      for (psStack_48 = (st_ptls_openssl_identity_t *)0x0; psStack_48 != new_identities[3];
          psStack_48 = (st_ptls_openssl_identity_t *)((long)&(psStack_48->name).base + 1)) {
        pOVar3 = ossl_check_const_X509_sk_type((stack_st_X509 *)slot);
        pXStack_88 = (X509 *)OPENSSL_sk_value(pOVar3,(ulong)psStack_48 & 0xffffffff);
        p._4_4_ = i2d_X509(pXStack_88,(uchar **)0x0);
        if (p._4_4_ < 1) {
          local_4c = 0x203;
          goto LAB_0011f1a8;
        }
        psVar4 = (st_ptls_openssl_identity_t *)malloc((long)p._4_4_);
        new_identities[(long)psStack_48 * 2 + 4] = psVar4;
        if (psVar4 == (st_ptls_openssl_identity_t *)0x0) {
          local_4c = 0x201;
          goto LAB_0011f1a8;
        }
        local_98 = new_identities[(long)psStack_48 * 2 + 4];
        iVar2 = i2d_X509(pXStack_88,(uchar **)&local_98);
        if (iVar2 != p._4_4_) {
          local_4c = 0x203;
          goto LAB_0011f1a8;
        }
        new_identities[(long)psStack_48 * 2 + 5] = (st_ptls_openssl_identity_t *)(long)p._4_4_;
      }
      pvVar5 = realloc(*(void **)(server_name_local + 8),
                       (*(long *)(server_name_local + 0x10) + 1) * 8);
      if (pvVar5 != (void *)0x0) {
        *(void **)(server_name_local + 8) = pvVar5;
        lVar1 = *(long *)(server_name_local + 0x10);
        *(long *)(server_name_local + 0x10) = lVar1 + 1;
        *(st_ptls_openssl_identity_t ***)(*(long *)(server_name_local + 8) + lVar1 * 8) =
             new_identities;
        return 0;
      }
      local_4c = 0x201;
      i = 0;
    }
  }
LAB_0011f1a8:
  if (new_identities != (st_ptls_openssl_identity_t **)0x0) {
    free_identity((st_ptls_openssl_identity_t *)new_identities);
  }
  return local_4c;
}

Assistant:

int ptls_openssl_lookup_certificate_add_identity(ptls_openssl_lookup_certificate_t *self, const char *server_name, EVP_PKEY *key,
                                                 STACK_OF(X509) * certs)
{
    struct st_ptls_openssl_identity_t *slot, **new_identities;
    size_t i;
    int ret;

    if ((slot = malloc(offsetof(struct st_ptls_openssl_identity_t, certs) + sizeof(slot->certs[0]) * sk_X509_num(certs))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }

    *slot = (struct st_ptls_openssl_identity_t){{NULL}};
    if ((slot->name.base = (uint8_t *)strdup(server_name)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }
    slot->name.len = strlen(server_name);

    EVP_PKEY_up_ref(key);
    slot->key = key;
    switch (EVP_PKEY_id(key)) {
    case EVP_PKEY_RSA:
        break;
    case EVP_PKEY_EC:
        if (!eckey_is_on_group(key, NID_X9_62_prime256v1)) {
            ret = PTLS_ERROR_INCOMPATIBLE_KEY;
            goto Error;
        }
        break;
    default:
        ret = PTLS_ERROR_INCOMPATIBLE_KEY;
        goto Error;
    }

    slot->num_certs = sk_X509_num(certs);
    for (i = 0; i != slot->num_certs; ++i) {
        X509 *cert = sk_X509_value(certs, (int)i);
        int len = i2d_X509(cert, NULL);
        if (len <= 0) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
        if ((slot->certs[i].base = malloc(len)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Error;
        }
        unsigned char *p = slot->certs[i].base;
        if (i2d_X509(cert, &p) != len) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
        slot->certs[i].len = len;
    }

    if ((new_identities = realloc(self->identities, sizeof(self->identities[0]) * (self->count + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }
    self->identities = new_identities;
    self->identities[self->count++] = slot;

    return 0;

Error:
    if (slot != NULL)
        free_identity(slot);
    return ret;
}